

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::LoadModel(Model *this,string *file)

{
  map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_> *this_00;
  int current_id;
  pointer piVar1;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar2;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar3;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar4;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar5;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar6;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar7;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar9;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar10;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar11;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar12;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar13;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar14;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar15;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar16;
  pointer psVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  long lVar21;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar22;
  size_t i_1;
  long lVar23;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *paVar24;
  undefined8 *puVar25;
  ulong uVar26;
  size_t i;
  byte bVar27;
  Model gltf_model;
  undefined1 local_7ac8 [8];
  undefined1 local_7ac0 [104];
  _Alloc_hider _Stack_7a58;
  pointer local_7a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a48 [973];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_3d78 [24];
  vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_> local_3d18;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_3d00;
  
  bVar27 = 0;
  tinygltf::Model::Model(&gltf_model);
  LoadglTFModel(&gltf_model,file);
  lVar23 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)gltf_model.meshes.
                              super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)gltf_model.meshes.
                             super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x158); uVar26 = uVar26 + 1
      ) {
    LoadglTFMesh((Mesh *)local_3d78,&gltf_model,
                 (Mesh *)((long)&((gltf_model.meshes.
                                   super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar23));
    local_7ac8 = (undefined1  [8])uVar26;
    Mesh::Mesh((Mesh *)local_7ac0,(Mesh *)local_3d78);
    std::
    _Rb_tree<int,std::pair<int_const,Mesh>,std::_Select1st<std::pair<int_const,Mesh>>,std::less<int>,std::allocator<std::pair<int_const,Mesh>>>
    ::_M_emplace_unique<std::pair<unsigned_long,Mesh>>
              ((_Rb_tree<int,std::pair<int_const,Mesh>,std::_Select1st<std::pair<int_const,Mesh>>,std::less<int>,std::allocator<std::pair<int_const,Mesh>>>
                *)&this->meshes,(pair<unsigned_long,_Mesh> *)local_7ac8);
    Mesh::~Mesh((Mesh *)local_7ac0);
    Mesh::~Mesh((Mesh *)local_3d78);
    lVar23 = lVar23 + 0x158;
  }
  this_00 = &this->nodes;
  for (uVar26 = 0;
      piVar1 = gltf_model.scenes.
               super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
               super__Vector_impl_data._M_start[gltf_model.defaultScene].nodes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,
      uVar26 < (ulong)((long)gltf_model.scenes.
                             super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
                             _M_impl.super__Vector_impl_data._M_start[gltf_model.defaultScene].nodes
                             .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar26 = uVar26 + 1) {
    current_id = piVar1[uVar26];
    LoadglTFNode(&gltf_model,
                 gltf_model.nodes.
                 super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
                 super__Vector_impl_data._M_start + current_id,-1,current_id,this_00);
  }
  for (uVar26 = 0; aVar22 = SUB84(uVar26,0),
      uVar26 < (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count; uVar26 = uVar26 + 1)
  {
    local_7ac8._0_4_ = aVar22;
    pmVar18 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::
              operator[](this_00,(key_type *)local_7ac8);
    if (-1 < pmVar18->mesh_id) {
      pmVar18 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::
                operator[](this_00,(key_type *)local_7ac8);
      local_3d78[0] = aVar22;
      pmVar19 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::
                operator[](this_00,(key_type *)local_3d78);
      pmVar20 = std::map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>::
                operator[](&this->meshes,&pmVar19->mesh_id);
      aVar13 = (pmVar18->matrix).value[0].field_0;
      aVar14 = (pmVar18->matrix).value[0].field_1;
      aVar15 = (pmVar18->matrix).value[0].field_2;
      aVar16 = (pmVar18->matrix).value[0].field_3;
      aVar9 = (pmVar18->matrix).value[1].field_0;
      aVar10 = (pmVar18->matrix).value[1].field_1;
      aVar11 = (pmVar18->matrix).value[1].field_2;
      aVar12 = (pmVar18->matrix).value[1].field_3;
      aVar5 = (pmVar18->matrix).value[2].field_0;
      aVar6 = (pmVar18->matrix).value[2].field_1;
      aVar7 = (pmVar18->matrix).value[2].field_2;
      aVar8 = (pmVar18->matrix).value[2].field_3;
      aVar2 = (pmVar18->matrix).value[3].field_1;
      aVar3 = (pmVar18->matrix).value[3].field_2;
      aVar4 = (pmVar18->matrix).value[3].field_3;
      (pmVar20->matrix).value[3].field_0 = (pmVar18->matrix).value[3].field_0;
      (pmVar20->matrix).value[3].field_1 = aVar2;
      (pmVar20->matrix).value[3].field_2 = aVar3;
      (pmVar20->matrix).value[3].field_3 = aVar4;
      (pmVar20->matrix).value[2].field_0 = aVar5;
      (pmVar20->matrix).value[2].field_1 = aVar6;
      (pmVar20->matrix).value[2].field_2 = aVar7;
      (pmVar20->matrix).value[2].field_3 = aVar8;
      (pmVar20->matrix).value[1].field_0 = aVar9;
      (pmVar20->matrix).value[1].field_1 = aVar10;
      (pmVar20->matrix).value[1].field_2 = aVar11;
      (pmVar20->matrix).value[1].field_3 = aVar12;
      (pmVar20->matrix).value[0].field_0 = aVar13;
      (pmVar20->matrix).value[0].field_1 = aVar14;
      (pmVar20->matrix).value[0].field_2 = aVar15;
      (pmVar20->matrix).value[0].field_3 = aVar16;
    }
  }
  lVar23 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)gltf_model.textures.
                              super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gltf_model.textures.
                             super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x130);
      uVar26 = uVar26 + 1) {
    LoadglTFTexture((Texture *)local_3d78,&gltf_model,
                    (Texture *)
                    ((long)&((gltf_model.textures.
                              super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                    lVar23));
    local_7ac8 = (undefined1  [8])uVar26;
    Texture::Texture((Texture *)local_7ac0,(Texture *)local_3d78);
    std::
    _Rb_tree<int,std::pair<int_const,Texture>,std::_Select1st<std::pair<int_const,Texture>>,std::less<int>,std::allocator<std::pair<int_const,Texture>>>
    ::_M_emplace_unique<std::pair<unsigned_long,Texture>>
              ((_Rb_tree<int,std::pair<int_const,Texture>,std::_Select1st<std::pair<int_const,Texture>>,std::less<int>,std::allocator<std::pair<int_const,Texture>>>
                *)&this->textures,(pair<unsigned_long,_Texture> *)local_7ac8);
    Texture::~Texture((Texture *)local_7ac0);
    Texture::~Texture((Texture *)local_3d78);
    lVar23 = lVar23 + 0x130;
  }
  lVar23 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)gltf_model.materials.
                              super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gltf_model.materials.
                             super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x860);
      uVar26 = uVar26 + 1) {
    LoadglTFMaterial((Material *)local_3d78,(Model *)0x860,
                     (Material *)
                     ((long)&((gltf_model.materials.
                               super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     lVar23));
    psVar17 = local_3d18.
              super__Vector_base<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    paVar24 = local_3d78;
    puVar25 = (undefined8 *)local_7ac0;
    for (lVar21 = 0xc; lVar21 != 0; lVar21 = lVar21 + -1) {
      *puVar25 = *(undefined8 *)paVar24;
      paVar24 = paVar24 + (ulong)bVar27 * -4 + 2;
      puVar25 = puVar25 + (ulong)bVar27 * -2 + 1;
    }
    local_7ac0._96_8_ =
         local_3d18.
         super__Vector_base<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Stack_7a58._M_p =
         (pointer)local_3d18.
                  super__Vector_base<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_3d18.
    super__Vector_base<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7a50 = psVar17;
    local_3d18.
    super__Vector_base<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d18.
    super__Vector_base<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7a48[0]._M_allocated_capacity._0_4_ = local_3d00;
    local_7ac8 = (undefined1  [8])uVar26;
    std::
    _Rb_tree<int,std::pair<int_const,Material>,std::_Select1st<std::pair<int_const,Material>>,std::less<int>,std::allocator<std::pair<int_const,Material>>>
    ::_M_emplace_unique<std::pair<unsigned_long,Material>>
              ((_Rb_tree<int,std::pair<int_const,Material>,std::_Select1st<std::pair<int_const,Material>>,std::less<int>,std::allocator<std::pair<int_const,Material>>>
                *)&this->materials,(pair<unsigned_long,_Material> *)local_7ac8);
    std::vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>::~vector
              ((vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_> *)
               (local_7ac0 + 0x60));
    std::vector<std::shared_ptr<Extension>,_std::allocator<std::shared_ptr<Extension>_>_>::~vector
              (&local_3d18);
    lVar23 = lVar23 + 0x860;
  }
  lVar23 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)gltf_model.animations.
                              super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gltf_model.animations.
                             super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x158);
      uVar26 = uVar26 + 1) {
    LoadglTFAnimation((Animation *)local_3d78,&gltf_model,
                      (Animation *)
                      ((long)&((gltf_model.animations.
                                super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar23));
    local_7ac8 = (undefined1  [8])uVar26;
    Animation::Animation((Animation *)local_7ac0,(Animation *)local_3d78);
    std::
    _Rb_tree<int,std::pair<int_const,Animation>,std::_Select1st<std::pair<int_const,Animation>>,std::less<int>,std::allocator<std::pair<int_const,Animation>>>
    ::_M_emplace_unique<std::pair<unsigned_long,Animation>>
              ((_Rb_tree<int,std::pair<int_const,Animation>,std::_Select1st<std::pair<int_const,Animation>>,std::less<int>,std::allocator<std::pair<int_const,Animation>>>
                *)&this->animations,(pair<unsigned_long,_Animation> *)local_7ac8);
    Animation::~Animation((Animation *)local_7ac0);
    Animation::~Animation((Animation *)local_3d78);
    lVar23 = lVar23 + 0x158;
  }
  lVar23 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)gltf_model.skins.
                              super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)gltf_model.skins.
                             super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x148); uVar26 = uVar26 + 1
      ) {
    LoadglTFSkin((Skin *)local_3d78,&gltf_model,
                 (Skin *)((long)&((gltf_model.skins.
                                   super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar23));
    local_7ac8 = (undefined1  [8])uVar26;
    Skin::Skin((Skin *)local_7ac0,(Skin *)local_3d78);
    std::
    _Rb_tree<int,std::pair<int_const,Skin>,std::_Select1st<std::pair<int_const,Skin>>,std::less<int>,std::allocator<std::pair<int_const,Skin>>>
    ::_M_emplace_unique<std::pair<unsigned_long,Skin>>
              ((_Rb_tree<int,std::pair<int_const,Skin>,std::_Select1st<std::pair<int_const,Skin>>,std::less<int>,std::allocator<std::pair<int_const,Skin>>>
                *)&this->skins,(pair<unsigned_long,_Skin> *)local_7ac8);
    Skin::~Skin((Skin *)local_7ac0);
    Skin::~Skin((Skin *)local_3d78);
    lVar23 = lVar23 + 0x148;
  }
  tinygltf::Model::~Model(&gltf_model);
  return;
}

Assistant:

void Model::LoadModel(const std::string &file) {
    tinygltf::Model gltf_model;
    LoadglTFModel(gltf_model, file);

    /* load the mesh data */
    for (std::size_t i = 0; i < gltf_model.meshes.size(); ++i) {
        meshes.insert(std::make_pair(i, LoadglTFMesh(gltf_model, gltf_model.meshes[i])));
    }

    /* load the node data                                */
    /* NOTE: only store node data from the default scene */
    const tinygltf::Scene &scene = gltf_model.scenes[gltf_model.defaultScene];
    for (std::size_t i = 0; i < scene.nodes.size(); ++i) {
        LoadglTFNode(gltf_model, gltf_model.nodes[scene.nodes[i]], -1, scene.nodes[i], nodes);
    }

    /* save the matrix information of the mesh */
    for (std::size_t i = 0; i < nodes.size(); ++i) {
        if (nodes[i].mesh_id > -1) {
            meshes[nodes[i].mesh_id].matrix = nodes[i].matrix;
        }
    }

    /* load the texture data */
    for (std::size_t i = 0; i < gltf_model.textures.size(); ++i) {
        textures.insert(std::make_pair(i, LoadglTFTexture(gltf_model, gltf_model.textures[i])));
    }

    /* load the material data */
    for (std::size_t i = 0; i < gltf_model.materials.size(); ++i) {
        materials.insert(std::make_pair(i, LoadglTFMaterial(gltf_model, gltf_model.materials[i])));
    }

    /* load the animation data */
    for (std::size_t i = 0; i < gltf_model.animations.size(); ++i) {
        animations.insert(std::make_pair(i, LoadglTFAnimation(gltf_model, gltf_model.animations[i])));
    }

    /* load the skin data */
    for (std::size_t i = 0; i < gltf_model.skins.size(); ++i) {
        skins.insert(std::make_pair(i, LoadglTFSkin(gltf_model, gltf_model.skins[i])));
    }
}